

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O2

int read_header(FILE *fp,char ***field_names)

{
  char cVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sz;
  long lVar6;
  char h_field [10000];
  char header [10000];
  
  if (fp != (FILE *)0x0) {
    ppcVar3 = (char **)malloc(8);
    *field_names = ppcVar3;
    if (ppcVar3 == (char **)0x0) {
      return -1;
    }
    sz = 0;
    memset(h_field,0,10000);
    pcVar4 = fgets(header,10000,(FILE *)fp);
    if (pcVar4 == (char *)0x0) {
      free(*field_names);
    }
    else {
      lVar6 = 0;
      while( true ) {
        uVar2 = 0;
        while( true ) {
          do {
            cVar1 = header[lVar6];
            lVar6 = lVar6 + 1;
          } while (cVar1 == '\r');
          if (cVar1 == '\0') {
            return (int)sz;
          }
          if ((cVar1 == ',') || (cVar1 == '\n')) break;
          uVar5 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
          h_field[uVar5] = cVar1;
        }
        ppcVar3 = (char **)realloc(*field_names,sz * 8 + 8);
        if (ppcVar3 == (char **)0x0) break;
        *field_names = ppcVar3;
        pcVar4 = strdup(h_field);
        ppcVar3[sz] = pcVar4;
        if (pcVar4 == (char *)0x0) goto LAB_0012d439;
        sz = (size_t)((int)sz + 1);
        memset(h_field,0,10000);
      }
      ppcVar3 = *field_names;
LAB_0012d439:
      free_cstr_arr(ppcVar3,sz);
    }
  }
  *field_names = (char **)0x0;
  return -1;
}

Assistant:

int read_header(FILE *fp, char ***field_names) {
    char **tmp_field_names;
    char header[LINE_MAX_LEN];
    char h_field[LINE_MAX_LEN];
    int h_field_index = 0;
    int h_field_len = 0;

    if (fp == NULL) {
        *field_names = NULL;
        return -1;
    }

    *field_names = malloc(sizeof(char *));
    if (*field_names == NULL) {
        return -1;
    }
    memset(h_field, 0, LINE_MAX_LEN);

    if (fgets(header, LINE_MAX_LEN, fp) == NULL) {
        free(*field_names);
        *field_names = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;

    while ((chr = header[++chr_pos - 1])) {
        if (chr == ',' || chr == '\n') {
            tmp_field_names = realloc(*field_names, (h_field_index + 1) * sizeof(char *));
            if (tmp_field_names == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }
            *field_names = tmp_field_names;
            (*field_names)[h_field_index] = strdup(h_field);

            if ((*field_names)[h_field_index] == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }

            memset(h_field, 0, LINE_MAX_LEN);
            h_field_len = 0;
            h_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            h_field[++h_field_len - 1] = chr;
        }
    }

    return h_field_index;
}